

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O2

double mpack_node_double_strict(mpack_node_t node)

{
  mpack_node_data_t *pmVar1;
  
  pmVar1 = node.data;
  if ((node.tree)->error != mpack_ok) {
    return 0.0;
  }
  if (pmVar1->type != mpack_type_double) {
    if (pmVar1->type == mpack_type_float) {
      return (double)(pmVar1->value).f;
    }
    mpack_tree_flag_error(node.tree,mpack_error_type);
    return 0.0;
  }
  return (pmVar1->value).d;
}

Assistant:

MPACK_INLINE double mpack_node_double_strict(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return 0.0;

    if (node.data->type == mpack_type_float)
        return (double)node.data->value.f;
    else if (node.data->type == mpack_type_double)
        return node.data->value.d;

    mpack_node_flag_error(node, mpack_error_type);
    return 0.0;
}